

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O3

void cvarfunc_fluid_interp(FIntCVar *self)

{
  uint uVar1;
  UCVarValue value;
  
  uVar1 = self->Value;
  if ((int)uVar1 < 0) {
    value.String = (char *)0x0;
  }
  else {
    switch(uVar1) {
    case 2:
      value = (UCVarValue)0x1;
      break;
    case 3:
    case 5:
      value = (UCVarValue)0x4;
      break;
    default:
      if (uVar1 < 8) {
        if (currSong != (MusInfo *)0x0) {
          (*currSong->_vptr_MusInfo[0x11])(currSong,"synth.interpolation");
          return;
        }
        return;
      }
    case 6:
      value = (UCVarValue)0x7;
    }
  }
  FBaseCVar::SetGenericRep(&self->super_FBaseCVar,value,CVAR_Int);
  return;
}

Assistant:

inline operator int () const { return Value; }